

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall google::protobuf::MessageLite::AppendToString(MessageLite *this,string *output)

{
  int iVar1;
  LogMessage *pLVar2;
  MessageLite *message;
  LogFinisher local_71;
  string local_70;
  LogMessage local_50;
  
  iVar1 = (*this->_vptr_MessageLite[5])();
  if ((char)iVar1 == '\0') {
    message = (MessageLite *)0x111;
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0x111);
    pLVar2 = internal::LogMessage::operator<<(&local_50,"CHECK failed: IsInitialized(): ");
    (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
              (&local_70,(_anonymous_namespace_ *)"serialize",(char *)this,message);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,&local_70);
    internal::LogFinisher::operator=(&local_71,pLVar2);
    std::__cxx11::string::~string((string *)&local_70);
    internal::LogMessage::~LogMessage(&local_50);
  }
  AppendPartialToString(this,output);
  return true;
}

Assistant:

bool MessageLite::AppendToString(string* output) const {
  GOOGLE_DCHECK(IsInitialized()) << InitializationErrorMessage("serialize", *this);
  return AppendPartialToString(output);
}